

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall TSMuxer::setMuxFormat(TSMuxer *this,string *format)

{
  int iVar1;
  uint8_t *puVar2;
  bool bVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)format);
  bVar3 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)format);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)format);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)format);
        bVar3 = iVar1 == 0;
      }
    }
  }
  this->m_m2tsMode = bVar3;
  iVar1 = 0x1ffff4;
  if (bVar3 != false) {
    iVar1 = 0x200000;
  }
  this->m_writeBlockSize = iVar1;
  puVar2 = (uint8_t *)operator_new__((ulong)(iVar1 + 0x400));
  this->m_outBuf = puVar2;
  this->m_frameSize = (uint)bVar3 * 4 + 0xbc;
  if (bVar3 != false) {
    (this->super_AbstractMuxer).m_sectorSize = 0x1800;
  }
  return;
}

Assistant:

void TSMuxer::setMuxFormat(const std::string& format)
{
    m_m2tsMode = format == "M2TS" || format == "M2T" || format == "MTS" || format == "SSIF";
    m_writeBlockSize = m_m2tsMode ? DEFAULT_FILE_BLOCK_SIZE : TS188_ROUND_BLOCK_SIZE;
    m_outBuf = new uint8_t[m_writeBlockSize + 1024];
    m_frameSize = m_m2tsMode ? 192 : 188;
    if (m_m2tsMode)
        m_sectorSize = 1024 * 6;
}